

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O0

void __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::subscribe
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,string *symbol,
          size_t max_orders)

{
  string *in_RSI;
  size_t unaff_retaddr;
  string *in_stack_00000008;
  nordic_itch_handler *in_stack_00000010;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  nordic_itch_handler::subscribe(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void moldudp_session<Handler>::subscribe(const std::string& symbol, size_t max_orders)
{
    _handler.subscribe(symbol, max_orders);
}